

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall QColumnView::setColumnWidths(QColumnView *this,QList<int> *list)

{
  QList<int> *this_00;
  int iVar1;
  long lVar2;
  ulong uVar3;
  QWidget *this_01;
  QWidgetData *pQVar4;
  uint uVar5;
  pointer piVar7;
  int iVar8;
  ulong uVar9;
  long asize;
  long in_FS_OFFSET;
  QSize local_40;
  long local_38;
  long lVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  uVar3 = (list->d).size;
  iVar8 = (int)uVar3;
  asize = (long)iVar8;
  lVar6 = *(long *)(lVar2 + 0x550);
  if (asize <= *(long *)(lVar2 + 0x550)) {
    lVar6 = asize;
  }
  uVar5 = (uint)lVar6;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  else {
    uVar9 = 0;
    do {
      this_01 = *(QWidget **)(*(long *)(lVar2 + 0x548) + uVar9 * 8);
      pQVar4 = this_01->data;
      local_40.wd.m_i = (list->d).ptr[uVar9];
      local_40.ht.m_i = ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1;
      QWidget::resize(this_01,&local_40);
      iVar1 = (list->d).ptr[uVar9];
      piVar7 = QList<int>::data((QList<int> *)(lVar2 + 0x558));
      piVar7[uVar9] = iVar1;
      uVar9 = uVar9 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar9);
  }
  this_00 = (QList<int> *)(lVar2 + 0x558);
  QList<int>::reserve(this_00,asize);
  if ((int)uVar5 < iVar8) {
    uVar9 = (ulong)uVar5;
    do {
      local_40.wd.m_i = (list->d).ptr[uVar9];
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)this_00,*(qsizetype *)(lVar2 + 0x568),(int *)&local_40);
      QList<int>::end(this_00);
      uVar9 = uVar9 + 1;
    } while ((uVar3 & 0xffffffff) != uVar9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnView::setColumnWidths(const QList<int> &list)
{
    Q_D(QColumnView);
    int i = 0;
    const int listCount = list.size();
    const int count = qMin(listCount, d->columns.size());
    for (; i < count; ++i) {
        d->columns.at(i)->resize(list.at(i), d->columns.at(i)->height());
        d->columnSizes[i] = list.at(i);
    }

    d->columnSizes.reserve(listCount);
    for (; i < listCount; ++i)
        d->columnSizes.append(list.at(i));
}